

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleWidget::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleWidget *this,Relation match)

{
  long lVar1;
  QObject *pQVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QAccessibleInterface *iface_1;
  QAccessibleInterface *iface;
  QArrayData local_a0;
  anon_class_8_1_54a39814_for__M_pred local_88;
  QObject **ppQStack_80;
  undefined1 *local_78;
  QString local_70;
  QWidgetList local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 1) != 0) {
    local_a0.ref_._q_value.super___atomic_base<int>._M_i = (Type)(__atomic_base<int>)0x1;
    lVar1 = (**(code **)(*(long *)this + 0x18))(this);
    lVar8 = 0;
    if ((*(byte *)(*(long *)(lVar1 + 8) + 0x30) & 1) != 0) {
      lVar8 = lVar1;
    }
    pQVar3 = *(QWidget **)(*(long *)(lVar8 + 8) + 0x10);
    if (pQVar3 != (QWidget *)0x0) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      _q_ac_childWidgets(&local_58,pQVar3);
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        lVar1 = local_58.d.size << 3;
        lVar8 = 0;
        do {
          pQVar2 = (QObject *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
          if (pQVar2 != (QObject *)0x0) {
            pQVar3 = QLabel::buddy((QLabel *)pQVar2);
            pQVar4 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
            if (pQVar4 == (QWidget *)0x0) {
              pQVar5 = (QWidget *)0x0;
            }
            else {
              pQVar5 = (QWidget *)0x0;
              if ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0) {
                pQVar5 = pQVar4;
              }
            }
            if (pQVar3 == pQVar5) {
              local_70.d.d = (Data *)QAccessible::queryAccessibleInterface(pQVar2);
              QtPrivate::
              QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
              emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                        ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                          *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                         (QAccessibleInterface **)&local_70,
                         (QFlags<QAccessible::RelationFlag> *)&local_a0);
              QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                        (__return_storage_ptr__);
            }
          }
          lVar8 = lVar8 + 8;
        } while (lVar1 != lVar8);
      }
      pQVar2 = (QObject *)QMetaObject::cast((QObject *)&QGroupBox::staticMetaObject);
      if (pQVar2 == (QObject *)0x0) {
        bVar9 = false;
      }
      else {
        QGroupBox::title(&local_70,(QGroupBox *)pQVar2);
        bVar9 = local_70.d.size != 0;
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (bVar9) {
        local_88.t = (QWindow **)QAccessible::queryAccessibleInterface(pQVar2);
        QtPrivate::QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
        ::emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                    *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                   (QAccessibleInterface **)&local_88,(QFlags<QAccessible::RelationFlag> *)&local_a0
                  );
        QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                  (__return_storage_ptr__);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 8) != 0) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (QWidget **)0x0;
    local_58.d.size = 0;
    (**(code **)(*(long *)this + 0x18))(this);
    if ((this->d->primarySignals).d.size != 0) {
      uVar6 = 0;
      do {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_88.t = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
        ppQStack_80 = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
        QString::toLatin1_helper((QString *)&local_a0);
        QObjectPrivate::receiverList((char *)&local_88);
        if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_a0._0_8_,1,0x10);
          }
        }
        QtPrivate::QCommonArrayOps<QObject_*>::growAppend
                  ((QCommonArrayOps<QObject_*> *)&local_58,ppQStack_80,ppQStack_80 + (long)local_78)
        ;
        if ((QArrayData *)local_88.t != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_88.t = *(int *)local_88.t + -1;
          UNLOCK();
          if (*(int *)local_88.t == 0) {
            QArrayData::deallocate((QArrayData *)local_88.t,8,0x10);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(this->d->primarySignals).d.size);
    }
    local_a0._0_8_ = (**(code **)(*(long *)this + 0x18))(this);
    local_88.t = (QWindow **)&local_a0;
    QtPrivate::
    sequential_erase_if<QList<QObject*>,QtPrivate::sequential_erase<QList<QObject*>,QObject*>(QList<QObject*>&,QObject*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QObject_*> *)&local_58,&local_88);
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      puVar7 = (undefined1 *)0x0;
      do {
        local_a0.ref_._q_value.super___atomic_base<int>._M_i = (Type)(__atomic_base<int>)0x8;
        local_88.t = (QWindow **)
                     QAccessible::queryAccessibleInterface
                               (&local_58.d.ptr[(long)puVar7]->super_QObject);
        if ((QArrayData *)local_88.t != (QArrayData *)0x0) {
          QtPrivate::
          QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
          emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                    ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                      *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                     (QAccessibleInterface **)&local_88,
                     (QFlags<QAccessible::RelationFlag> *)&local_a0);
          QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                    (__return_storage_ptr__);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < (ulong)local_58.d.size);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleWidget::relations(QAccessible::Relation match /*= QAccessible::AllRelations*/) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels;
    if (match & QAccessible::Label) {
        const QAccessible::Relation rel = QAccessible::Label;
        if (QWidget *parent = widget()->parentWidget()) {
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
            // first check for all siblings that are labels to us
            // ideally we would go through all objects and check, but that
            // will be too expensive
            const QList<QWidget*> kids = _q_ac_childWidgets(parent);
            for (QWidget *kid : kids) {
                if (QLabel *labelSibling = qobject_cast<QLabel*>(kid)) {
                    if (labelSibling->buddy() == widget()) {
                        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(labelSibling);
                        rels.emplace_back(iface, rel);
                    }
                }
            }
#endif
#if QT_CONFIG(groupbox)
            QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
            if (groupbox && !groupbox->title().isEmpty()) {
                QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(groupbox);
                rels.emplace_back(iface, rel);
            }
#endif
        }
    }

    if (match & QAccessible::Controlled) {
        QObjectList allReceivers;
        QObject *connectionObject = object();
        for (int sig = 0; sig < d->primarySignals.size(); ++sig) {
            const QObjectList receivers = connectionObject->d_func()->receiverList(d->primarySignals.at(sig).toLatin1());
            allReceivers += receivers;
        }

        allReceivers.removeAll(object());  //### The object might connect to itself internally

        for (int i = 0; i < allReceivers.size(); ++i) {
            const QAccessible::Relation rel = QAccessible::Controlled;
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(allReceivers.at(i));
            if (iface)
                rels.emplace_back(iface, rel);
        }
    }

    return rels;
}